

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  bool bVar1;
  LogMessage *this;
  char *in_RCX;
  string_view src;
  double result;
  double local_48;
  LogMessage local_40;
  string local_30;
  
  local_48 = 0.0;
  bVar1 = TryParseFloat(text,&local_48);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3f9);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_40,
                      (char (*) [85])
                      " Tokenizer::ParseFloat() passed text that could not have been tokenized as a float: "
                     );
    src._M_str = in_RCX;
    src._M_len = (size_t)(text->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_30,(lts_20250127 *)text->_M_string_length,src);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_40);
  }
  return local_48;
}

Assistant:

double Tokenizer::ParseFloat(const std::string& text) {
  double result = 0;
  if (!TryParseFloat(text, &result)) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseFloat() passed text that could not have been"
           " tokenized as a float: "
        << absl::CEscape(text);
  }
  return result;
}